

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

IVec4 __thiscall tcu::getFormatMaxIntValue(tcu *this,TextureFormat *format)

{
  ChannelOrder CVar1;
  ChannelType CVar2;
  undefined8 in_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX;
  int s;
  IVec4 IVar4;
  
  CVar1 = format->order;
  CVar2 = format->type;
  uVar3 = CONCAT71((int7)((ulong)in_RDX >> 8),CVar1 == RGBA);
  if ((CVar1 == BGRA || CVar1 == RGBA) && CVar2 == SIGNED_INT_1010102_REV) {
    *(undefined8 *)this = 0x1ff000001ff;
    *(undefined8 *)(this + 8) = 0x1000001ff;
  }
  else {
    if (CVar2 == SIGNED_INT32) {
      s = 0x7fffffff;
    }
    else if (CVar2 == SIGNED_INT16) {
      s = 0x7fff;
    }
    else if (CVar2 == SIGNED_INT8) {
      s = 0x7f;
    }
    else {
      s = 0;
    }
    Vector<int,_4>::Vector((Vector<int,_4> *)this,s);
    uVar3 = extraout_RDX;
  }
  IVar4.m_data[2] = (int)uVar3;
  IVar4.m_data[3] = (int)((ulong)uVar3 >> 0x20);
  IVar4.m_data._0_8_ = this;
  return (IVec4)IVar4.m_data;
}

Assistant:

IVec4 getFormatMaxIntValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER);

	if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::SIGNED_INT_1010102_REV) ||
		format == TextureFormat(TextureFormat::BGRA, TextureFormat::SIGNED_INT_1010102_REV))
		return IVec4(511, 511, 511, 1);

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:	return IVec4(std::numeric_limits<deInt8>::max());
		case TextureFormat::SIGNED_INT16:	return IVec4(std::numeric_limits<deInt16>::max());
		case TextureFormat::SIGNED_INT32:	return IVec4(std::numeric_limits<deInt32>::max());

		default:
			DE_FATAL("Invalid channel type");
			return IVec4(0);
	}
}